

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O3

QStringList * __thiscall
QRegularExpression::namedCaptureGroups(QStringList *__return_storage_ptr__,QRegularExpression *this)

{
  ushort *puVar1;
  ushort uVar2;
  pcre2_code_16 *ppVar3;
  QArrayData *data;
  char16_t *pcVar4;
  qsizetype qVar5;
  pointer pQVar6;
  uint uVar7;
  long in_FS_OFFSET;
  uint namedCapturingTableEntrySize;
  uint namedCapturingTableEntryCount;
  PCRE2_SPTR16 *namedCapturingTable;
  QString local_60;
  int local_48;
  uint local_44;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QRegularExpressionPrivate::compilePattern((this->d).d.ptr);
  ppVar3 = ((this->d).d.ptr)->compiledPattern;
  if (ppVar3 == (pcre2_code_16 *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QString *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_44 = 0xaaaaaaaa;
    local_48 = -0x55555556;
    pcre2_pattern_info_16(ppVar3,0x13);
    pcre2_pattern_info_16(((this->d).d.ptr)->compiledPattern,0x11,&local_44);
    pcre2_pattern_info_16(((this->d).d.ptr)->compiledPattern,0x12,&local_48);
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList(__return_storage_ptr__,(long)((this->d).d.ptr)->capturingCount + 1);
    if (local_44 != 0) {
      uVar7 = 0;
      do {
        puVar1 = (ushort *)(local_40 + (ulong)(local_48 * uVar7) * 2);
        uVar2 = *puVar1;
        qVar5 = QtPrivate::qustrlen((char16_t *)(puVar1 + 1));
        QString::QString(&local_60,(QChar *)(puVar1 + 1),qVar5);
        pQVar6 = QList<QString>::data(__return_storage_ptr__);
        data = &(pQVar6[uVar2].d.d)->super_QArrayData;
        pQVar6[uVar2].d.d = local_60.d.d;
        pcVar4 = pQVar6[uVar2].d.ptr;
        pQVar6[uVar2].d.ptr = local_60.d.ptr;
        qVar5 = pQVar6[uVar2].d.size;
        pQVar6[uVar2].d.size = local_60.d.size;
        local_60.d.d = (Data *)data;
        local_60.d.ptr = pcVar4;
        local_60.d.size = qVar5;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,2,0x10);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_44);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QStringList QRegularExpression::namedCaptureGroups() const
{
    if (!isValid()) // isValid() will compile the pattern
        return QStringList();

    // namedCapturingTable will point to a table of
    // namedCapturingTableEntryCount entries, each one of which
    // contains one ushort followed by the name, NUL terminated.
    // The ushort is the numerical index of the name in the pattern.
    // The length of each entry is namedCapturingTableEntrySize.
    PCRE2_SPTR16 *namedCapturingTable;
    unsigned int namedCapturingTableEntryCount;
    unsigned int namedCapturingTableEntrySize;

    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMETABLE, &namedCapturingTable);
    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMECOUNT, &namedCapturingTableEntryCount);
    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMEENTRYSIZE, &namedCapturingTableEntrySize);

    // The +1 is for the implicit group #0
    QStringList result(d->capturingCount + 1);

    for (unsigned int i = 0; i < namedCapturingTableEntryCount; ++i) {
        const auto currentNamedCapturingTableRow =
                reinterpret_cast<const char16_t *>(namedCapturingTable) + namedCapturingTableEntrySize * i;

        const int index = *currentNamedCapturingTableRow;
        result[index] = QStringView(currentNamedCapturingTableRow + 1).toString();
    }

    return result;
}